

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  _GLOBAL__N_1 a_Stack_28 [16];
  
  if (0 < (long)desc->field_count_) {
    pFVar1 = desc->fields_;
    lVar3 = 0;
    do {
      if (((&pFVar1->field_0x3)[lVar3] & 1) == 0) {
        if (((&pFVar1->field_0x1)[lVar3] & 0x10) != 0) {
          if (*(long *)((long)&pFVar1->scope_ + lVar3) != 0) {
            return true;
          }
          goto LAB_00d554ba;
        }
      }
      else {
        if (((&pFVar1->field_0x1)[lVar3] & 0x10) == 0) {
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb63);
        }
        lVar4 = *(long *)((long)&pFVar1->scope_ + lVar3);
        if (lVar4 == 0) {
LAB_00d554ba:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        if ((*(int *)(lVar4 + 4) == 1) && ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) != 0)) {
          compiler::_GLOBAL__N_1::ContainsProto3Optional(a_Stack_28);
          goto LAB_00d554ba;
        }
      }
      lVar3 = lVar3 + 0x58;
    } while ((long)desc->field_count_ * 0x58 - lVar3 != 0);
  }
  if (desc->nested_type_count_ < 1) {
    bVar2 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar2 = ContainsProto3Optional((Descriptor *)(&desc->nested_types_->super_SymbolBase + lVar3))
      ;
      if (bVar2) {
        return bVar2;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa0;
    } while (lVar4 < desc->nested_type_count_);
  }
  return bVar2;
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}